

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

bool __thiscall QFontComboBox::event(QFontComboBox *this,QEvent *e)

{
  QWidgetData *pQVar1;
  bool bVar2;
  QObject *object;
  QWidget *this_00;
  QWidget *this_01;
  int iVar3;
  int w;
  QRect QVar4;
  
  if (*(short *)(e + 8) == 0xe) {
    object = (QObject *)QComboBox::view(&this->super_QComboBox);
    this_00 = (QWidget *)QtPrivate::qobject_cast_helper<QListView*,QObject>(object);
    if (this_00 != (QWidget *)0x0) {
      this_01 = QWidget::window(this_00);
      pQVar1 = (this->super_QComboBox).super_QWidget.data;
      iVar3 = (((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) * 5 + 5) / 3;
      QVar4 = QWidgetPrivate::availableScreenGeometry(this_00);
      w = (QVar4.x2.m_i.m_i - QVar4.x1.m_i) + 1;
      if (iVar3 < w) {
        w = iVar3;
      }
      QWidget::setFixedWidth(this_01,w);
    }
  }
  bVar2 = QComboBox::event(&this->super_QComboBox,e);
  return bVar2;
}

Assistant:

bool QFontComboBox::event(QEvent *e)
{
    if (e->type() == QEvent::Resize) {
        QListView *lview = qobject_cast<QListView*>(view());
        if (lview) {
            lview->window()->setFixedWidth(qMin(width() * 5 / 3,
                                           QWidgetPrivate::availableScreenGeometry(lview).width()));
        }
    }
    return QComboBox::event(e);
}